

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_183::Flower::filterExpressionContents
          (Flower *this,PossibleContents *contents,ExpressionLocation *exprLoc,
          bool *worthSendingMore)

{
  __index_type *p_Var1;
  TNHOracle *pTVar2;
  iterator iVar3;
  variant_alternative_t<3UL,_variant<None,_Literal,_GlobalInfo,_ConeType,_Many>_> *pvVar4;
  bool bVar5;
  _Variadic_union<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_78;
  undefined1 local_60;
  undefined1 local_58 [8];
  PossibleContents maximalContents;
  bool __ret;
  
  p_Var1 = *(__index_type **)&exprLoc->tupleIndex;
  if (((__index_type *)0x6 < p_Var1 & (byte)p_Var1) == 0) {
    bVar5 = ((ulong)p_Var1 & 1) == 0;
    if ((bVar5 && (__index_type *)0x6 < p_Var1) && (*worthSendingMore == false)) {
      __assert_fail("!isRef || worthSendingMore",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                    ,0xa8a,
                    "void wasm::(anonymous namespace)::Flower::filterExpressionContents(PossibleContents &, const ExpressionLocation &, bool &)"
                   );
    }
    pTVar2 = (this->tnhOracle)._M_t.
             super___uniq_ptr_impl<wasm::(anonymous_namespace)::TNHOracle,_std::default_delete<wasm::(anonymous_namespace)::TNHOracle>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::TNHOracle_*,_std::default_delete<wasm::(anonymous_namespace)::TNHOracle>_>
             .super__Head_base<0UL,_wasm::(anonymous_namespace)::TNHOracle_*,_false>._M_head_impl;
    if (pTVar2 == (TNHOracle *)0x0) {
      maximalContents.value.
      super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      ._M_u._0_4_ = 0xffffffff;
      maximalContents.value.
      super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      ._M_u._16_1_ = 3;
      local_58 = (undefined1  [8])p_Var1;
    }
    else {
      local_78._8_4_ = 0xffffffff;
      local_60 = 3;
      local_78._0_8_ = p_Var1;
      maximalContents.value.
      super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      ._24_8_ = exprLoc;
      iVar3 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::PossibleContents>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::PossibleContents>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(pTVar2->inferences)._M_h,
                     (key_type *)
                     &maximalContents.value.
                      super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                      .
                      super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                      .
                      super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                      .
                      super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                      .
                      super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                      .
                      super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                      ._M_index);
      if (iVar3.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::PossibleContents>,_false>
          ._M_cur == (__node_type *)0x0) {
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                           *)local_58,
                          (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                           *)&local_78);
      }
      else {
        if (*(char *)((long)iVar3.
                            super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::PossibleContents>,_false>
                            ._M_cur + 0x28) == '\x03') {
          pvVar4 = std::
                   get<3ul,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                             ((variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                               *)((long)iVar3.
                                        super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::PossibleContents>,_false>
                                        ._M_cur + 0x10));
          if (((undefined1 *)(pvVar4->type).id == (undefined1 *)local_78._0_8_) &&
             (pvVar4->depth == local_78._8_4_)) {
            __assert_fail("contents != naiveContents",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                          ,0x5dc,
                          "PossibleContents wasm::(anonymous namespace)::TNHOracle::getContents(Expression *)"
                         );
          }
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                           *)local_58,
                          (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                           *)((long)iVar3.
                                    super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::PossibleContents>,_false>
                                    ._M_cur + 0x10));
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                           *)&local_78);
    }
    PossibleContents::intersect(contents,(PossibleContents *)local_58);
    if ((bVar5 && (__index_type *)0x6 < p_Var1) &&
        (contents->value).
        super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        .
        super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
        ._M_index == '\x03') {
      normalizeConeType(this,contents);
      normalizeConeType(this,(PossibleContents *)local_58);
      local_78._0_8_ =
           &maximalContents.value.
            super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            .
            super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            .
            super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            .
            super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            .
            super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            .
            super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
            ._M_index;
      maximalContents.value.
      super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      .
      super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      ._M_index = '\x01';
      local_78._8_8_ = contents;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>_&>
        ::_S_vtable._M_arr
        [(long)(char)maximalContents.value.
                     super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     ._M_u._16_1_ + 1]._M_data)
                ((anon_class_16_2_9763bfdf *)&local_78,
                 (variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                  *)local_58);
      if (maximalContents.value.
          super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          .
          super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          .
          super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          .
          super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          .
          super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          .
          super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          ._M_index == '\x01') {
        *worthSendingMore = false;
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
    ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                         *)local_58);
  }
  return;
}

Assistant:

void Flower::filterExpressionContents(PossibleContents& contents,
                                      const ExpressionLocation& exprLoc,
                                      bool& worthSendingMore) {
  auto type = exprLoc.expr->type;

  if (type.isTuple()) {
    // TODO: Optimize tuples here as well. We would need to take into account
    //       exprLoc.tupleIndex for that in all the below.
    return;
  }

  // The caller cannot know of a situation where it might not be worth sending
  // more to a reference - all that logic is in here. That is, the rest of this
  // function is the only place we can mark |worthSendingMore| as false for a
  // reference.
  bool isRef = type.isRef();
  assert(!isRef || worthSendingMore);

  // The TNH oracle informs us of the maximal contents possible here.
  auto maximalContents = getTNHContents(exprLoc.expr);
#if defined(POSSIBLE_CONTENTS_DEBUG) && POSSIBLE_CONTENTS_DEBUG >= 2
  std::cout << "TNHOracle informs us that " << *exprLoc.expr << " contains "
            << maximalContents << "\n";
#endif
  contents.intersect(maximalContents);
  if (contents.isNone()) {
    // Nothing was left here at all.
    return;
  }

  // For references we need to normalize the intersection, see below. For non-
  // references, we are done (we did all the relevant work in the intersect()
  // call).
  if (!isRef) {
    return;
  }

  // Normalize the intersection. We want to check later if any more content can
  // arrive here, and also we want to avoid flowing around anything non-
  // normalized, as explained earlier.
  //
  // Note that this normalization is necessary even though |contents| was
  // normalized before the intersection, e.g.:
  /*
  //      A
  //     / \
  //    B   C
  //        |
  //        D
  */
  // Consider the case where |maximalContents| is Cone(B, Infinity) and the
  // original |contents| was Cone(A, 2) (which is normalized). The naive
  // intersection is Cone(B, 1), since the core intersection logic makes no
  // assumptions about the rest of the types. That is then normalized to
  // Cone(B, 0) since there happens to be no subtypes for B.
  //
  // Note that the intersection may also not be a cone type, if it is a global
  // or literal. In that case we don't have anything more to do here.
  if (!contents.isConeType()) {
    return;
  }

  normalizeConeType(contents);

  // There is a chance that the intersection is equal to the maximal contents,
  // which would mean nothing more can arrive here.
  normalizeConeType(maximalContents);

  if (contents == maximalContents) {
    // We already contain everything possible, so this is the worst case.
    worthSendingMore = false;
  }
}